

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double poisson_cdf(int k,double a)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"POISSON_CDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    dVar2 = 0.0;
  }
  else if (-1 < k) {
    dVar2 = exp(-a);
    dVar3 = 1.0;
    dVar4 = dVar2;
    while (bVar1 = k != 0, k = k + -1, bVar1) {
      dVar4 = (dVar4 * a) / dVar3;
      dVar2 = dVar2 + dVar4;
      dVar3 = dVar3 + 1.0;
    }
  }
  return dVar2;
}

Assistant:

double poisson_cdf ( int k, double a )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_CDF evaluates the Poisson CDF.
//
//  Discussion:
//
//    CDF(K,A) is the probability that the number of events observed
//    in a unit time period will be no greater than K, given that the
//    expected number of events in a unit time period is A.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int K, the argument of the CDF.
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Output, double POISSON_CDF, the value of the CDF.
//
{
  double cdf;
  int i;
  double last;
  double next;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_CDF - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Special cases.
//
  if ( k < 0 )
  {
    cdf = 0.0;
    return cdf;
  }
//
//  General case.
//
  next = exp ( - a );
  cdf = next;

  for ( i = 1; i <= k; i++ )
  {
    last = next;
    next = last * a / static_cast< double > ( i);
    cdf = cdf + next;
  }

  return cdf;
}